

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_br_fillup(lzh_stream *strm,lzh_br *br)

{
  uint64_t uVar1;
  byte *pbVar2;
  int local_24;
  wchar_t x;
  wchar_t n;
  lzh_br *br_local;
  lzh_stream *strm_local;
  
  local_24 = 0x40 - br->cache_avail;
  while( true ) {
    if (local_24 >> 3 <= strm->avail_in) {
      switch(local_24 >> 3) {
      case 0:
        return L'\x01';
      default:
        break;
      case 6:
        br->cache_buffer =
             br->cache_buffer << 0x30 | (ulong)*strm->next_in << 0x28 |
             (ulong)strm->next_in[1] << 0x20 | (ulong)strm->next_in[2] << 0x18 |
             (ulong)strm->next_in[3] << 0x10 | (ulong)strm->next_in[4] << 8 |
             (ulong)strm->next_in[5];
        strm->next_in = strm->next_in + 6;
        strm->avail_in = strm->avail_in + L'\xfffffffa';
        br->cache_avail = br->cache_avail + L'0';
        return L'\x01';
      case 7:
        br->cache_buffer =
             br->cache_buffer << 0x38 | (ulong)*strm->next_in << 0x30 |
             (ulong)strm->next_in[1] << 0x28 | (ulong)strm->next_in[2] << 0x20 |
             (ulong)strm->next_in[3] << 0x18 | (ulong)strm->next_in[4] << 0x10 |
             (ulong)strm->next_in[5] << 8 | (ulong)strm->next_in[6];
        strm->next_in = strm->next_in + 7;
        strm->avail_in = strm->avail_in + L'\xfffffff9';
        br->cache_avail = br->cache_avail + L'8';
        return L'\x01';
      case 8:
        br->cache_buffer =
             (ulong)*strm->next_in << 0x38 | (ulong)strm->next_in[1] << 0x30 |
             (ulong)strm->next_in[2] << 0x28 | (ulong)strm->next_in[3] << 0x20 |
             (ulong)strm->next_in[4] << 0x18 | (ulong)strm->next_in[5] << 0x10 |
             (ulong)strm->next_in[6] << 8 | (ulong)strm->next_in[7];
        strm->next_in = strm->next_in + 8;
        strm->avail_in = strm->avail_in + L'\xfffffff8';
        br->cache_avail = br->cache_avail + L'@';
        return L'\x01';
      }
    }
    if (strm->avail_in == L'\0') break;
    uVar1 = br->cache_buffer;
    pbVar2 = strm->next_in;
    strm->next_in = pbVar2 + 1;
    br->cache_buffer = uVar1 << 8 | (ulong)*pbVar2;
    strm->avail_in = strm->avail_in + L'\xffffffff';
    br->cache_avail = br->cache_avail + L'\b';
    local_24 = local_24 + -8;
  }
  return L'\0';
}

Assistant:

static int
lzh_br_fillup(struct lzh_stream *strm, struct lzh_br *br)
{
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		const int x = n >> 3;
		if (strm->avail_in >= x) {
			switch (x) {
			case 8:
				br->cache_buffer =
				    ((uint64_t)strm->next_in[0]) << 56 |
				    ((uint64_t)strm->next_in[1]) << 48 |
				    ((uint64_t)strm->next_in[2]) << 40 |
				    ((uint64_t)strm->next_in[3]) << 32 |
				    ((uint32_t)strm->next_in[4]) << 24 |
				    ((uint32_t)strm->next_in[5]) << 16 |
				    ((uint32_t)strm->next_in[6]) << 8 |
				     (uint32_t)strm->next_in[7];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			case 7:
				br->cache_buffer =
		 		   (br->cache_buffer << 56) |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint64_t)strm->next_in[3]) << 24 |
				    ((uint64_t)strm->next_in[4]) << 16 |
				    ((uint64_t)strm->next_in[5]) << 8 |
				     (uint64_t)strm->next_in[6];
				strm->next_in += 7;
				strm->avail_in -= 7;
				br->cache_avail += 7 * 8;
				return (1);
			case 6:
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[0]) << 40 |
				    ((uint64_t)strm->next_in[1]) << 32 |
				    ((uint64_t)strm->next_in[2]) << 24 |
				    ((uint64_t)strm->next_in[3]) << 16 |
				    ((uint64_t)strm->next_in[4]) << 8 |
				     (uint64_t)strm->next_in[5];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			case 0:
				/* We have enough compressed data in
				 * the cache buffer.*/
				return (1);
			default:
				break;
			}
		}
		if (strm->avail_in == 0) {
			/* There is not enough compressed data to fill up the
			 * cache buffer. */
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 8) | *strm->next_in++;
		strm->avail_in--;
		br->cache_avail += 8;
		n -= 8;
	}
}